

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,string *filename,int N)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  _Ios_Openmode _Var4;
  invalid_argument *this_00;
  ulong uVar5;
  int *piVar6;
  int local_294;
  int i_3;
  int *vtemp;
  int i_2;
  int j;
  int i_1;
  int i;
  int tempy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  char local_230 [8];
  ofstream fil;
  int local_1c;
  int N_local;
  string *filename_local;
  Vector *this_local;
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_0010bcf0;
  std::__cxx11::string::string((string *)&this->filename_);
  std::__cxx11::string::operator=((string *)&this->filename_,(string *)filename);
  std::ofstream::ofstream(local_230);
  _Var4 = std::__cxx11::string::c_str();
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open(local_230,_Var4);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) != 0) {
    std::ofstream::close();
    if (N < 0) {
      this->znak = -1;
    }
    else {
      this->znak = 1;
    }
    local_1c = N;
    if (N < 1) {
      local_1c = -N;
    }
    i_1 = 1;
    j = 1;
    while (i_1 = i_1 * 10, i_1 <= local_1c) {
      j = j + 1;
    }
    this->L = j;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->L;
    uVar5 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar6 = (int *)operator_new__(uVar5);
    this->vector_ = piVar6;
    i_2 = this->L;
    while (i_2 = i_2 + -1, -1 < i_2) {
      this->vector_[i_2] = local_1c % 10;
      local_1c = local_1c / 10;
    }
    vtemp._4_4_ = 0;
    for (vtemp._0_4_ = 0; ((int)vtemp < this->L + -1 && (this->vector_[(int)vtemp] < 1));
        vtemp._0_4_ = (int)vtemp + 1) {
      vtemp._4_4_ = vtemp._4_4_ + 1;
    }
    if (0 < vtemp._4_4_) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(this->L - vtemp._4_4_);
      uVar5 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      piVar6 = (int *)operator_new__(uVar5);
      for (local_294 = 0; local_294 < this->L - vtemp._4_4_; local_294 = local_294 + 1) {
        piVar6[local_294] = this->vector_[local_294 + vtemp._4_4_];
      }
      if (this->vector_ != (int *)0x0) {
        operator_delete__(this->vector_);
      }
      this->vector_ = piVar6;
      this->L = this->L - vtemp._4_4_;
    }
    std::ofstream::~ofstream(local_230);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempy,
                 "Error! Cannot open file ",&this->filename_);
  std::operator+(&local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tempy,"!\n");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_250);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Vector::Vector(const std::string& filename, int N) {
    filename_ = filename;
    std::ofstream fil;
    fil.open(filename_.c_str(), std::ios_base::out | std::ios::trunc);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + filename_ + "!\n");
    }
    fil.close();
    if (N>=0){
        this->znak=1;
    }else{
        this->znak=-1;
    }
    N=std::abs(N);
    int tempy=1;
    for (int i=1;;i++){
        tempy*=10;
        if (tempy>N){
            this->L=i;
            break;
        }
    }
    this->vector_=new int[L];
    for(int i=L-1;i>=0;i--){
        this->vector_[i]=N%10;
        N=N/10;
    }
    int j=0;
    for (int i=0; i<L-1; i++){
        if (vector_[i]>0){
            break;
        }else{
            j+=1;
        }
    }
    if (j>0){
        int* vtemp;
        vtemp=new int[L-j];
        for (int i=0;i<L-j;i++){
            vtemp[i]=vector_[i+j];
        }
        delete [] vector_;
        this->vector_=vtemp;
        L=L-j;
    }
  }